

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# availableprofiles.c
# Opt level: O2

int check_available(void)

{
  char *profile;
  size_t __n;
  long lVar1;
  uint uVar2;
  size_t sVar3;
  char **ppcVar4;
  ulong uVar5;
  ulong uVar6;
  undefined8 uStackY_50;
  char *pcStack_38;
  
  uStackY_50 = 0x10846b;
  uVar2 = MOJOSHADER_glAvailableProfiles
                    (lookup,(void *)0x0,(char **)0x0,0,(MOJOSHADER_malloc)0x0,(MOJOSHADER_free)0x0,
                     (void *)0x0);
  ppcVar4 = &pcStack_38;
  if (0 < (int)uVar2) {
    lVar1 = -((ulong)uVar2 * 8 + 0xf & 0xfffffffffffffff0);
    *(undefined8 *)(&stack0xffffffffffffffb8 + lVar1) = 0;
    *(undefined8 *)((long)&uStackY_50 + lVar1) = 0x1084ac;
    uVar2 = MOJOSHADER_glAvailableProfiles
                      (lookup,(void *)0x0,(char **)((long)&pcStack_38 + lVar1),uVar2,
                       (MOJOSHADER_malloc)0x0,(MOJOSHADER_free)0x0,
                       *(void **)(&stack0xffffffffffffffb8 + lVar1));
    ppcVar4 = (char **)((long)&pcStack_38 + lVar1);
    if (0 < (int)uVar2) {
      uVar5 = (ulong)uVar2;
      for (uVar6 = 0; uVar5 != uVar6; uVar6 = uVar6 + 1) {
        profile = ((char **)((long)&pcStack_38 + lVar1))[uVar6];
        *(undefined8 *)(&stack0xffffffffffffffc0 + lVar1) = 0x1084d2;
        uVar2 = MOJOSHADER_maxShaderModel(profile);
        *(undefined8 *)(&stack0xffffffffffffffc0 + lVar1) = 0x1084e1;
        uVar2 = printf("%s (Shader Model %d)\n",profile,(ulong)uVar2);
      }
      return uVar2;
    }
  }
  *(undefined8 *)((long)ppcVar4 + -8) = 0x17;
  sVar3 = *(size_t *)((long)ppcVar4 + -8);
  *(undefined8 *)((long)ppcVar4 + -8) = 1;
  __n = *(size_t *)((long)ppcVar4 + -8);
  *(undefined8 *)((long)ppcVar4 + -8) = 0x108502;
  sVar3 = fwrite("No profiles available.\n",sVar3,__n,_stderr);
  return (int)sVar3;
}

Assistant:

static int check_available(void)
{
    const char **avail = NULL;
    int total = MOJOSHADER_glAvailableProfiles(lookup, NULL, NULL, 0, NULL, NULL, NULL);
    if (total > 0)
    {
        avail = (const char **) alloca(sizeof (const char *) * total);
        total = MOJOSHADER_glAvailableProfiles(lookup, NULL, avail, total, NULL, NULL, NULL);
    } // if

    if (total <= 0)
        fprintf(stderr, "No profiles available.\n");
    else
    {
        int i;
        for (i = 0; i < total; i++)
        {
            printf("%s (Shader Model %d)\n", avail[i],
                   MOJOSHADER_maxShaderModel(avail[i]));
        } // for
    } // else

    return 0;
}